

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

void phosg::print_data(FILE *stream,iovec *iovs,size_t num_iovs,uint64_t start_address,
                      iovec *prev_iovs,size_t num_prev_iovs,uint64_t flags)

{
  int iVar1;
  FILE *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_60 = stream;
  if ((flags & 0x81) == 0) {
    iVar1 = fileno((FILE *)stream);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) {
      flags = flags | 0x80;
    }
    else {
      flags = flags | 1;
    }
  }
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = &local_60;
  pcStack_40 = ::std::
               _Function_handler<void_(const_void_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/Strings.cc:833:21)>
               ::_M_invoke;
  local_48 = ::std::
             _Function_handler<void_(const_void_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/Strings.cc:833:21)>
             ::_M_manager;
  format_data((function<void_(const_void_*,_unsigned_long)> *)&local_58,iovs,num_iovs,start_address,
              prev_iovs,num_prev_iovs,flags);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

void print_data(
    FILE* stream,
    const struct iovec* iovs,
    size_t num_iovs,
    uint64_t start_address,
    const struct iovec* prev_iovs,
    size_t num_prev_iovs,
    uint64_t flags) {
  if (!(flags & (PrintDataFlags::USE_COLOR | PrintDataFlags::DISABLE_COLOR))) {
    if (isatty(fileno(stream))) {
      flags |= PrintDataFlags::USE_COLOR;
    } else {
      flags |= PrintDataFlags::DISABLE_COLOR;
    }
  }
  auto write_data = [&](const void* data, size_t size) -> void {
    fwrite(data, size, 1, stream);
  };
  format_data(write_data, iovs, num_iovs, start_address, prev_iovs, num_prev_iovs, flags);
}